

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall QTextCursor::setCharFormat(QTextCursor *this,QTextCharFormat *format)

{
  Type TVar1;
  int iVar2;
  QTextCursorPrivate *pQVar3;
  
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar3 = (this->d).d.ptr;
    }
    if (pQVar3->priv != (QTextDocumentPrivate *)0x0) {
      if ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      iVar2 = pQVar3->position;
      if ((__int_type)
          (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      TVar1.super___atomic_base<int>._M_i =
           (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>;
      if (iVar2 != pQVar3->anchor) {
        if (TVar1.super___atomic_base<int>._M_i != 1) {
          QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
          pQVar3 = (this->d).d.ptr;
        }
        QTextCursorPrivate::setCharFormat(pQVar3,format,SetFormatAndPreserveObjectIndices);
        return;
      }
      if (TVar1.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      iVar2 = QTextFormatCollection::indexForFormat
                        (&pQVar3->priv->formats,&format->super_QTextFormat);
      pQVar3 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar3 = (this->d).d.ptr;
      }
      pQVar3->currentCharFormat = iVar2;
    }
  }
  return;
}

Assistant:

void QTextCursor::setCharFormat(const QTextCharFormat &format)
{
    if (!d || !d->priv)
        return;
    if (d->position == d->anchor) {
        d->currentCharFormat = d->priv->formatCollection()->indexForFormat(format);
        return;
    }
    d->setCharFormat(format, QTextDocumentPrivate::SetFormatAndPreserveObjectIndices);
}